

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<EnumNameValue>::reallocateAndGrow
          (QArrayDataPointer<EnumNameValue> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<EnumNameValue> *old)

{
  Data *pDVar1;
  EnumNameValue *pEVar2;
  qsizetype qVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<EnumNameValue> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (EnumNameValue *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar4 = this->size + (n >> 0x3f & n);
    if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<EnumNameValue> *)0x0)) ||
       (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QtPrivate::QGenericArrayOps<EnumNameValue>::copyAppend
                ((QGenericArrayOps<EnumNameValue> *)&local_38,this->ptr,this->ptr + lVar4);
    }
    else {
      QtPrivate::QGenericArrayOps<EnumNameValue>::moveAppend
                ((QGenericArrayOps<EnumNameValue> *)&local_38,this->ptr,this->ptr + lVar4);
    }
  }
  pDVar1 = this->d;
  pEVar2 = this->ptr;
  this->d = local_38.d;
  this->ptr = local_38.ptr;
  qVar3 = this->size;
  this->size = local_38.size;
  local_38.d = pDVar1;
  local_38.ptr = pEVar2;
  local_38.size = qVar3;
  if (old != (QArrayDataPointer<EnumNameValue> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = pDVar1;
    old->ptr = pEVar2;
    local_38.size = old->size;
    old->size = qVar3;
  }
  ~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }